

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDHPublicKey.cpp
# Opt level: O1

void __thiscall OSSLDHPublicKey::createOSSLKey(OSSLDHPublicKey *this)

{
  DH *dh;
  DH_METHOD *meth;
  BIGNUM *pBVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  
  if (this->dh != (DH *)0x0) {
    return;
  }
  dh = DH_new();
  this->dh = (DH *)dh;
  if (dh != (DH *)0x0) {
    meth = DH_OpenSSL();
    DH_set_method(dh,meth);
    pBVar1 = OSSL::byteString2bn(&(this->super_DHPublicKey).p);
    pBVar2 = OSSL::byteString2bn(&(this->super_DHPublicKey).g);
    pBVar3 = OSSL::byteString2bn(&(this->super_DHPublicKey).y);
    DH_set0_pqg(this->dh,pBVar1,0,pBVar2);
    DH_set0_key(this->dh,pBVar3,0);
    return;
  }
  softHSMLog(3,"createOSSLKey",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLDHPublicKey.cpp"
             ,0x95,"Could not create DH object");
  return;
}

Assistant:

void OSSLDHPublicKey::createOSSLKey()
{
	if (dh != NULL) return;

	dh = DH_new();
	if (dh == NULL)
	{
		ERROR_MSG("Could not create DH object");
		return;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		DH_set_method(dh, FIPS_dh_openssl());
	else
		DH_set_method(dh, DH_OpenSSL());
#else
	DH_set_method(dh, DH_OpenSSL());
#endif

#else
	DH_set_method(dh, DH_OpenSSL());
#endif

	BIGNUM* bn_p = OSSL::byteString2bn(p);
	BIGNUM* bn_g = OSSL::byteString2bn(g);
	BIGNUM* bn_pub_key = OSSL::byteString2bn(y);

	DH_set0_pqg(dh, bn_p, NULL, bn_g);
	DH_set0_key(dh, bn_pub_key, NULL);
}